

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::AssertionStats::AssertionStats(AssertionStats *this,AssertionStats *param_2)

{
  long in_RSI;
  undefined8 *in_RDI;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *in_stack_00000018;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *in_stack_00000020;
  AssertionResult *in_stack_ffffffffffffffc8;
  
  *in_RDI = &PTR__AssertionStats_003897a0;
  AssertionResult::AssertionResult((AssertionResult *)(in_RDI + 1),in_stack_ffffffffffffffc8);
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (in_stack_00000020,in_stack_00000018);
  memcpy(in_RDI + 0x16,(void *)(in_RSI + 0xb0),0x38);
  return;
}

Assistant:

AssertionStats( AssertionStats const& )              = default;